

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O0

Ptr<Semaphore> myvk::Semaphore::Create(Ptr<Device> *device)

{
  PFN_vkCreateSemaphore p_Var1;
  VkResult VVar2;
  element_type *this;
  VkDevice pVVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<Semaphore> PVar5;
  VkSemaphoreCreateInfo info;
  shared_ptr<myvk::Semaphore> ret;
  shared_ptr<myvk::Device> *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  VkSemaphoreCreateInfo local_38 [2];
  
  std::make_shared<myvk::Semaphore>();
  std::__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2cb654);
  std::shared_ptr<myvk::Device>::operator=
            ((shared_ptr<myvk::Device> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78
            );
  p_Var1 = vkCreateSemaphore;
  local_38[0].pNext = (void *)0x0;
  local_38[0].flags = 0;
  local_38[0]._20_4_ = 0;
  local_38[0].sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
  local_38[0]._4_4_ = 0;
  this = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    0x2cb697);
  pVVar3 = Device::GetHandle(this);
  peVar4 = std::__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2cb6b0);
  VVar2 = (*p_Var1)(pVVar3,local_38,(VkAllocationCallbacks *)0x0,&peVar4->m_semaphore);
  if (VVar2 == VK_SUCCESS) {
    std::shared_ptr<myvk::Semaphore>::shared_ptr
              ((shared_ptr<myvk::Semaphore> *)(ulong)in_stack_ffffffffffffff80,
               (shared_ptr<myvk::Semaphore> *)in_stack_ffffffffffffff78);
  }
  else {
    std::shared_ptr<myvk::Semaphore>::shared_ptr
              ((shared_ptr<myvk::Semaphore> *)CONCAT44(VVar2,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
  }
  std::shared_ptr<myvk::Semaphore>::~shared_ptr((shared_ptr<myvk::Semaphore> *)0x2cb72c);
  PVar5.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar5.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Semaphore>)PVar5.super___shared_ptr<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Semaphore> Semaphore::Create(const Ptr<Device> &device) {
	auto ret = std::make_shared<Semaphore>();
	ret->m_device_ptr = device;

	VkSemaphoreCreateInfo info = {};
	info.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
	if (vkCreateSemaphore(device->GetHandle(), &info, nullptr, &ret->m_semaphore) != VK_SUCCESS)
		return nullptr;
	return ret;
}